

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCommunicationsNode.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::IOCommunicationsNode::IOCommunicationsNode
          (IOCommunicationsNode *this,IOCommunicationsNodeType T,CommunicationsNodeID *ID)

{
  KUINT16 KVar1;
  
  StandardVariable::StandardVariable(&this->super_StandardVariable);
  (this->super_StandardVariable).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__IOCommunicationsNode_00226cc0;
  (this->super_StandardVariable).field_0xe = (char)T;
  (this->super_StandardVariable).field_0xf = 0;
  (this->m_CommID).super_EntityIdentifier.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__SimulationIdentifier_00217f20;
  KVar1 = (ID->super_EntityIdentifier).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->m_CommID).super_EntityIdentifier.super_SimulationIdentifier.m_ui16SiteID =
       (ID->super_EntityIdentifier).super_SimulationIdentifier.m_ui16SiteID;
  (this->m_CommID).super_EntityIdentifier.super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_CommID).super_EntityIdentifier.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__CommunicationsNodeID_00226d70;
  *(undefined4 *)&(this->m_CommID).super_EntityIdentifier.super_SimulationIdentifier.field_0xc =
       *(undefined4 *)&(ID->super_EntityIdentifier).super_SimulationIdentifier.field_0xc;
  (this->super_StandardVariable).m_ui32Type = 0x157d;
  (this->super_StandardVariable).m_ui16Length = 0x10;
  return;
}

Assistant:

IOCommunicationsNode::IOCommunicationsNode( IOCommunicationsNodeType T, const CommunicationsNodeID & ID ) :
    m_ui8CommNodeTyp( T ),
    m_ui8Padding( 0 ),
    m_CommID( ID )
{
    m_ui32Type = IOCommunicationsNodeRecord;
    m_ui16Length = IO_COMMUNICATIONS_NODE_SIZE;
}